

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
pbrt::GBufferFilm::GBufferFilm
          (GBufferFilm *this,FilmBaseParameters *p,RGBColorSpace *colorSpace,Float maxComponentValue
          ,bool writeFP16,Allocator alloc)

{
  Float *pFVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  ulong uVar6;
  PixelSensor *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 (*pauVar11) [64];
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  SquareMatrix<3> *pSVar16;
  GaussianFilter *this_00;
  LanczosSincFilter *this_01;
  PixelSensor *pPVar17;
  long lVar18;
  PixelSensor *pPVar19;
  int k;
  long lVar20;
  long in_FS_OFFSET;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  float fVar25;
  SquareMatrix<3> r;
  undefined1 auStack_a8 [8];
  Float local_a0;
  Float local_9c [9];
  undefined1 auStack_78 [48];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  auStack_78._16_8_ = (p->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  auStack_78._0_8_ = (p->fullResolution).super_Tuple2<pbrt::Point2,_int>;
  auStack_78._8_8_ = (p->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  auStack_78._24_8_ =
       (p->filter).
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       .bits;
  auStack_78._32_4_ = p->diagonal;
  auStack_78._36_4_ = *(undefined4 *)&p->field_0x24;
  auStack_78._40_8_ = p->sensor;
  pcVar5 = (p->filename)._M_dataplus._M_p;
  local_a0 = maxComponentValue;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar5,pcVar5 + (p->filename)._M_string_length);
  FilmBase::FilmBase(&this->super_FilmBase,(FilmBaseParameters *)auStack_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  Array2D<pbrt::GBufferFilm::Pixel>::Array2D
            (&this->pixels,&(this->super_FilmBase).pixelBounds,(allocator_type)alloc.memoryResource)
  ;
  this->colorSpace = colorSpace;
  this->maxComponentValue = local_a0;
  this->writeFP16 = writeFP16;
  uVar6 = (this->super_FilmBase).filter.
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          .bits;
  uVar12 = (uint)(ushort)(uVar6 >> 0x30);
  if (uVar6 >> 0x30 < 3) {
    this_00 = (GaussianFilter *)(uVar6 & 0xffffffffffff);
    if (uVar12 == 2) {
      fVar25 = GaussianFilter::Integral(this_00);
    }
    else {
      fVar2 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x;
      fVar2 = fVar2 + fVar2;
      fVar25 = (fVar2 + fVar2) * (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.y;
    }
  }
  else {
    uVar12 = uVar12 - 2;
    this_01 = (LanczosSincFilter *)(uVar6 & 0xffffffffffff);
    if (uVar12 < 2) {
      fVar25 = (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.x *
               (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.y * 0.25;
    }
    else if (uVar12 == 2) {
      fVar25 = LanczosSincFilter::Integral(this_01);
    }
    else {
      fVar2 = (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.x;
      fVar25 = (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.y;
      fVar25 = fVar25 * fVar2 * fVar2 * fVar25;
    }
  }
  this->filterIntegral = fVar25;
  auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  lVar14 = 0;
  pSVar16 = &this->outputRGBFromSensorRGB;
  do {
    auVar23 = vpbroadcastq_avx512f();
    lVar14 = lVar14 + 1;
    uVar8 = vpcmpeqq_avx512f(auVar23,auVar21);
    uVar9 = vpcmpeqq_avx512f(auVar23,auVar22);
    auVar23 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar9,(char)uVar8));
    auVar23 = vpsrld_avx512f(auVar23,0x1f);
    auVar23 = vcvtdq2ps_avx512f(auVar23);
    auVar23._12_4_ = pSVar16->m[1][0];
    auVar23._16_4_ = pSVar16->m[1][1];
    auVar23._20_4_ = pSVar16->m[1][2];
    auVar23._24_4_ = pSVar16->m[2][0];
    auVar23._28_4_ = pSVar16->m[2][1];
    auVar23._32_4_ = pSVar16->m[2][2];
    auVar23._36_4_ = *(undefined4 *)(pSVar16 + 1);
    auVar23._40_4_ = *(undefined4 *)((long)(pSVar16 + 1) + 4);
    auVar23._44_4_ = *(undefined4 *)((long)(pSVar16 + 1) + 8);
    auVar23._48_4_ = *(undefined4 *)((long)(pSVar16 + 1) + 0xc);
    auVar23._52_4_ = *(undefined4 *)((long)(pSVar16 + 1) + 0x10);
    auVar23._56_4_ = *(undefined4 *)((long)(pSVar16 + 1) + 0x14);
    auVar23._60_4_ = *(undefined4 *)((long)(pSVar16 + 1) + 0x18);
    *(undefined1 (*) [64])pSVar16 = auVar23;
    pSVar16 = (SquareMatrix<3> *)(pSVar16->m + 1);
  } while (lVar14 != 3);
  iVar3 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  iVar4 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar13 = iVar3 - iVar4;
  if ((iVar13 != 0 && iVar4 <= iVar3) &&
     (iVar3 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y,
     iVar4 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y,
     iVar15 = iVar3 - iVar4, iVar15 != 0 && iVar4 <= iVar3)) {
    lVar14 = 0;
    *(long *)(in_FS_OFFSET + -0x558) =
         *(long *)(in_FS_OFFSET + -0x558) + (long)(iVar15 * iVar13) * 0xb0;
    pPVar7 = (this->super_FilmBase).sensor;
    pauVar11 = (undefined1 (*) [64])auStack_a8;
    do {
      auVar23 = vpbroadcastq_avx512f();
      lVar14 = lVar14 + 1;
      uVar8 = vpcmpeqq_avx512f(auVar23,auVar21);
      uVar9 = vpcmpeqq_avx512f(auVar23,auVar22);
      auVar23 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar9,(char)uVar8));
      auVar23 = vpsrld_avx512f(auVar23,0x1f);
      auVar23 = vcvtdq2ps_avx512f(auVar23);
      auVar24._0_12_ = auVar23._0_12_;
      auVar24._12_4_ = *(undefined4 *)(*pauVar11 + 0x18);
      auVar24._16_4_ = *(undefined4 *)(*pauVar11 + 0x1c);
      auVar24._20_4_ = *(undefined4 *)(*pauVar11 + 0x20);
      auVar24._24_4_ = *(undefined4 *)(*pauVar11 + 0x24);
      auVar24._28_4_ = *(undefined4 *)(*pauVar11 + 0x28);
      auVar24._32_4_ = *(undefined4 *)(*pauVar11 + 0x2c);
      auVar24._36_4_ = *(undefined4 *)(*pauVar11 + 0x30);
      auVar24._40_4_ = *(undefined4 *)(*pauVar11 + 0x34);
      auVar24._44_4_ = *(undefined4 *)(*pauVar11 + 0x38);
      auVar24._48_4_ = *(undefined4 *)(*pauVar11 + 0x3c);
      auVar24._52_4_ = *(undefined4 *)pauVar11[1];
      auVar24._56_4_ = *(undefined4 *)(pauVar11[1] + 4);
      auVar24._60_4_ = *(undefined4 *)(pauVar11[1] + 8);
      *(undefined1 (*) [64])(*pauVar11 + 0xc) = auVar24;
      pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0xc);
    } while (lVar14 != 3);
    pSVar16 = &colorSpace->RGBFromXYZ;
    lVar14 = 0;
    do {
      lVar18 = 0;
      pPVar17 = pPVar7;
      do {
        auVar21 = ZEXT1664((undefined1  [16])0x0);
        lVar20 = 0;
        pPVar19 = pPVar17;
        do {
          pFVar1 = pSVar16->m[0] + lVar20;
          lVar20 = lVar20 + 1;
          auVar10 = vfmadd231ss_fma(auVar21._0_16_,ZEXT416((uint)*pFVar1),
                                    ZEXT416((uint)(pPVar19->XYZFromSensorRGB).m[0][0]));
          auVar21 = ZEXT1664(auVar10);
          pPVar19 = (PixelSensor *)((pPVar19->XYZFromSensorRGB).m + 1);
        } while (lVar20 != 3);
        local_9c[lVar14 * 3 + lVar18] = auVar10._0_4_;
        lVar18 = lVar18 + 1;
        pPVar17 = (PixelSensor *)((pPVar17->XYZFromSensorRGB).m[0] + 1);
      } while (lVar18 != 3);
      lVar14 = lVar14 + 1;
      pSVar16 = (SquareMatrix<3> *)(pSVar16->m + 1);
    } while (lVar14 != 3);
    (this->outputRGBFromSensorRGB).m[2][2] = local_9c[8];
    *(undefined8 *)(this->outputRGBFromSensorRGB).m[0] = local_9c._0_8_;
    *(undefined8 *)((this->outputRGBFromSensorRGB).m[0] + 2) = local_9c._8_8_;
    *(undefined8 *)((this->outputRGBFromSensorRGB).m[1] + 1) = local_9c._16_8_;
    *(undefined8 *)(this->outputRGBFromSensorRGB).m[2] = local_9c._24_8_;
    return;
  }
  LogFatal<char_const(&)[23]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,0x27a,"Check failed: %s",(char (*) [23])"!pixelBounds.IsEmpty()");
}

Assistant:

GBufferFilm::GBufferFilm(FilmBaseParameters p, const RGBColorSpace *colorSpace,
                         Float maxComponentValue, bool writeFP16, Allocator alloc)
    : FilmBase(p),
      pixels(pixelBounds, alloc),
      colorSpace(colorSpace),
      maxComponentValue(maxComponentValue),
      writeFP16(writeFP16),
      filterIntegral(filter.Integral()) {
    CHECK(!pixelBounds.IsEmpty());
    filmPixelMemory += pixelBounds.Area() * sizeof(Pixel);
    outputRGBFromSensorRGB = colorSpace->RGBFromXYZ * sensor->XYZFromSensorRGB;
}